

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  ushort uVar1;
  ushort uVar2;
  ObjectValues *pOVar3;
  ObjectValues *pOVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ushort uVar11;
  uint *__s;
  uint uVar12;
  uint *__s_00;
  bool bVar13;
  size_t sVar10;
  
  uVar1 = *(ushort *)&this->bits_;
  uVar2 = *(ushort *)&other->bits_;
  uVar11 = uVar2 & 0xff;
  bVar13 = (uVar1 & 0xff) < uVar11;
  if ((uVar1 & 0xff) == uVar11) {
    switch((char)uVar1) {
    case '\0':
      bVar13 = false;
      break;
    case '\x01':
      bVar13 = (this->value_).int_ < (other->value_).int_;
      break;
    case '\x02':
      bVar13 = (this->value_).uint_ < (other->value_).uint_;
      break;
    case '\x03':
      bVar13 = (this->value_).real_ <= (other->value_).real_ &&
               (other->value_).real_ != (this->value_).real_;
      break;
    case '\x04':
      __s = (uint *)(this->value_).string_;
      __s_00 = (uint *)(other->value_).string_;
      if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
        bVar13 = __s_00 != (uint *)0x0;
      }
      else {
        if ((uVar1 >> 8 & 1) == 0) {
          sVar10 = strlen((char *)__s);
          uVar8 = (uint)sVar10;
        }
        else {
          uVar8 = *__s;
          __s = __s + 1;
        }
        if ((uVar2 >> 8 & 1) == 0) {
          sVar10 = strlen((char *)__s_00);
          uVar12 = (uint)sVar10;
        }
        else {
          uVar12 = *__s_00;
          __s_00 = __s_00 + 1;
        }
        uVar7 = uVar8;
        if (uVar12 < uVar8) {
          uVar7 = uVar12;
        }
        iVar9 = memcmp(__s,__s_00,(ulong)uVar7);
        bVar13 = true;
        if (-1 < iVar9) {
          bVar13 = uVar8 < uVar12 && iVar9 == 0;
        }
      }
      break;
    case '\x05':
      bVar13 = (this->value_).bool_ < (other->value_).bool_;
      break;
    case '\x06':
    case '\a':
      pOVar3 = (this->value_).map_;
      pOVar4 = (other->value_).map_;
      uVar5 = (pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      uVar6 = (pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      bVar13 = uVar6 < uVar5;
      if (uVar6 == uVar5) {
        bVar13 = std::
                 __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,std::_Rb_tree_const_iterator<std::pair<Json::Value::CZString_const,Json::Value>>,__gnu_cxx::__ops::_Iter_less_iter>
                           ((pOVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            &(pOVar3->_M_t)._M_impl.super__Rb_tree_header,
                            (pOVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            &(pOVar4->_M_t)._M_impl.super__Rb_tree_header);
        return bVar13;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x217,"bool Json::Value::operator<(const Value &) const");
    }
  }
  return bVar13;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}